

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O1

char * skipDollarQuotedString(char *zSql,char *delimiterStart,idx_t delimiterLength)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *unaff_R12;
  
  do {
    if (*zSql == '$') {
      for (lVar3 = 1; zSql[lVar3] != '\0'; lVar3 = lVar3 + 1) {
        if (zSql[lVar3] == '$') {
          if ((lVar3 - delimiterLength == 1) &&
             (iVar2 = bcmp(zSql + 1,delimiterStart,delimiterLength), iVar2 == 0)) {
            unaff_R12 = zSql + lVar3;
            bVar1 = false;
            zSql = unaff_R12;
          }
          else {
            bVar1 = true;
          }
          goto LAB_00d1adbc;
        }
      }
      zSql = zSql + lVar3;
      unaff_R12 = (char *)0x0;
      bVar1 = false;
LAB_00d1adbc:
      if (!bVar1) {
        return unaff_R12;
      }
    }
    else if (*zSql == '\0') {
      return (char *)0x0;
    }
    zSql = zSql + 1;
  } while( true );
}

Assistant:

const char *skipDollarQuotedString(const char *zSql, const char *delimiterStart, idx_t delimiterLength) {
	for (; *zSql; zSql++) {
		if (*zSql == '$') {
			// found a dollar
			// move forward and find the next dollar
			zSql++;
			auto start = zSql;
			while (*zSql && *zSql != '$') {
				zSql++;
			}
			if (!zSql[0]) {
				// reached end of string while looking for the dollar
				return nullptr;
			}
			// check if the dollar quoted string name matches
			if (delimiterLength == idx_t(zSql - start)) {
				if (memcmp(start, delimiterStart, delimiterLength) == 0) {
					return zSql;
				}
			}
			// dollar does not match - reset position to start and keep looking
			zSql = start - 1;
		}
	}
	// unterminated
	return nullptr;
}